

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O3

string * __thiscall
SchemaConverter::_not_strings
          (string *__return_storage_ptr__,SchemaConverter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *strings)

{
  pointer pbVar1;
  iterator iVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer string;
  string char_rule;
  TrieNode trie;
  ostringstream out;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  string local_200;
  TrieNode local_1e0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1e0.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e0.children._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1e0.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e0.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e0.children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e0.is_end_of_string = false;
  string = (strings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (strings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_1e0.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e0.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (string != pbVar1) {
    do {
      _not_strings(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::
      TrieNode::insert(std::__cxx11::string_const__(&local_1e0,string);
      string = string + 1;
    } while (string != pbVar1);
  }
  local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x72616863;
  local_1a8[0]._M_string_length = 4;
  local_1a8[0].field_2._M_allocated_capacity._4_4_ =
       local_1a8[0].field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_220._8_8_ = 4;
  local_210._0_5_ = 0x72616863;
  local_220._0_8_ = local_210;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&PRIMITIVE_RULES_abi_cxx11_._M_h,(key_type *)local_220);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_true>
      ._M_cur != (__node_type *)0x0) {
    _add_primitive(&local_200,this,local_1a8,
                   (BuiltinRule *)
                   ((long)iVar2.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_true>
                          ._M_cur + 0x28));
    if ((undefined1 *)local_220._0_8_ != local_210) {
      operator_delete((void *)local_220._0_8_,local_210._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,
                      CONCAT44(local_1a8[0].field_2._M_allocated_capacity._4_4_,
                               (undefined4)local_1a8[0].field_2._M_allocated_capacity) + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[\"] ( ",6);
    local_220._8_8_ = 0;
    local_220._0_8_ = operator_new(0x18);
    ((anon_class_24_3_d264b97f *)local_220._0_8_)->out = (ostringstream *)local_1a8;
    ((anon_class_24_3_d264b97f *)local_220._0_8_)->visit =
         (function<void_(const_TrieNode_&)> *)local_220;
    ((anon_class_24_3_d264b97f *)local_220._0_8_)->char_rule = &local_200;
    local_210._8_8_ =
         std::
         _Function_handler<void_(const_TrieNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json-schema-to-grammar.cpp:605:55)>
         ::_M_invoke;
    local_210._0_8_ =
         std::
         _Function_handler<void_(const_TrieNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json-schema-to-grammar.cpp:605:55)>
         ::_M_manager;
    _not_strings::anon_class_24_3_d264b97f::operator()
              ((anon_class_24_3_d264b97f *)local_220._0_8_,&local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," )",2);
    if (local_1e0.is_end_of_string == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"?",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [\"] space",10);
    std::__cxx11::stringbuf::str();
    if ((code *)local_210._0_8_ != (code *)0x0) {
      (*(code *)local_210._0_8_)(local_220,local_220,3);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<char,_std::pair<const_char,_TrieNode>,_std::_Select1st<std::pair<const_char,_TrieNode>_>,_std::less<char>,_std::allocator<std::pair<const_char,_TrieNode>_>_>
    ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_TrieNode>,_std::_Select1st<std::pair<const_char,_TrieNode>_>,_std::less<char>,_std::allocator<std::pair<const_char,_TrieNode>_>_>
                 *)&local_1e0);
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_out_of_range("_Map_base::at");
  __clang_call_terminate(uVar3);
}

Assistant:

std::string _not_strings(const std::vector<std::string> & strings) {

        struct TrieNode {
            std::map<char, TrieNode> children;
            bool is_end_of_string;

            TrieNode() : is_end_of_string(false) {}

            void insert(const std::string & string) {
                auto node = this;
                for (char c : string) {
                    node = &node->children[c];
                }
                node->is_end_of_string = true;
            }
        };

        TrieNode trie;
        for (const auto & s : strings) {
            trie.insert(s);
        }

        std::string char_rule = _add_primitive("char", PRIMITIVE_RULES.at("char"));
        std::ostringstream out;
        out << "[\"] ( ";
        std::function<void(const TrieNode &)> visit = [&](const TrieNode & node) {
            std::ostringstream rejects;
            auto first = true;
            for (const auto & kv : node.children) {
                rejects << kv.first;
                if (first) {
                    first = false;
                } else {
                    out << " | ";
                }
                out << "[" << kv.first << "]";
                if (!kv.second.children.empty()) {
                    out << " (";
                    visit(kv.second);
                    out << ")";
                } else if (kv.second.is_end_of_string) {
                    out << " " << char_rule << "+";
                }
            }
            if (!node.children.empty()) {
                if (!first) {
                    out << " | ";
                }
                out << "[^\"" << rejects.str() << "] " << char_rule << "*";
            }
        };
        visit(trie);

        out << " )";
        if (!trie.is_end_of_string) {
            out << "?";
        }
        out << " [\"] space";
        return out.str();
    }